

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

TRef fwd_ahload(jit_State *J,IRRef xref)

{
  ushort uVar1;
  AliasRet AVar2;
  TRef TVar3;
  cTValue *pcVar4;
  IRIns *pIVar5;
  IRIns *local_88;
  IRIns *load;
  IRIns *key;
  cTValue *tv;
  TValue keyv;
  IRIns *store_1;
  IRIns *newref;
  IRRef ref2;
  IRRef tab;
  IRIns *ir;
  IRIns *store;
  IRRef ref;
  IRRef lim;
  IRIns *xr;
  jit_State *pjStack_18;
  IRRef xref_local;
  jit_State *J_local;
  
  _ref = (J->cur).ir + xref;
  uVar1 = J->chain[(int)((J->fold).ins.field_1.o + 8)];
  store._4_4_ = xref;
  xr._4_4_ = xref;
  pjStack_18 = J;
  while (store._0_4_ = (uint)uVar1, xr._4_4_ < (uint)store) {
    ir = (pjStack_18->cur).ir + (uint)store;
    AVar2 = aa_ahref(pjStack_18,_ref,(pjStack_18->cur).ir + (ir->field_0).op1);
    if (AVar2 != ALIAS_NO) {
      if (AVar2 == ALIAS_MAY) {
        store._4_4_ = (uint)store;
        goto LAB_001a55bb;
      }
      if (AVar2 == ALIAS_MUST) {
        return (uint)(ir->field_0).op2;
      }
    }
    uVar1 = (ir->field_0).prev;
  }
  if (((_ref->field_1).o == '9') || ((_ref->field_1).o == '8')) {
    local_88 = (pjStack_18->cur).ir + (_ref->field_0).op1;
  }
  else {
    local_88 = _ref;
  }
  newref._4_4_ = (uint)(local_88->field_0).op1;
  _ref2 = (pjStack_18->cur).ir + newref._4_4_;
  if (((_ref2->field_1).o == 'Q') || (((_ref2->field_1).o == 'R' && ((_ref->field_0).op2 < 0x8000)))
     ) {
    if ((_ref->field_1).o == '8') {
      uVar1 = pjStack_18->chain[0x3b];
      while (newref._0_4_ = (uint)uVar1, newref._4_4_ < (uint)newref) {
        store_1 = (pjStack_18->cur).ir + (uint)newref;
        if ((*(byte *)((long)(pjStack_18->cur).ir + (ulong)(store_1->field_0).op2 * 8 + 4) & 0x1f)
            == 0xe) goto LAB_001a55bb;
        uVar1 = (store_1->field_0).prev;
      }
    }
    while (newref._4_4_ < (uint)store) {
      keyv.u64 = (uint64_t)((pjStack_18->cur).ir + (uint)store);
      AVar2 = aa_ahref(pjStack_18,_ref,(pjStack_18->cur).ir + *(ushort *)keyv);
      if (AVar2 != ALIAS_NO) {
        if (AVar2 == ALIAS_MAY) goto LAB_001a55bb;
        if (AVar2 == ALIAS_MUST) {
          return (uint)*(ushort *)(keyv.u64 + 2);
        }
      }
      store._0_4_ = (uint)*(ushort *)(keyv.u64 + 6);
    }
    if (((_ref2->field_1).o == 'Q') && (((pjStack_18->fold).ins.field_1.t.irt & 0x1f) != 0)) {
      return 0;
    }
    if (((pjStack_18->fold).ins.field_1.t.irt & 0x1f) < 3) {
      return (0x7fff - ((pjStack_18->fold).ins.field_1.t.irt & 0x1f)) +
             ((pjStack_18->fold).ins.field_1.t.irt & 0x1f) * 0x1000000;
    }
    if ((((pjStack_18->fold).ins.field_1.t.irt & 0x1f) == 0xe) ||
       (((pjStack_18->fold).ins.field_1.t.irt & 0x1f) == 4)) {
      load = (pjStack_18->cur).ir + (_ref->field_0).op2;
      if ((load->field_1).o == '\x1e') {
        load = (pjStack_18->cur).ir + (load->field_0).op1;
      }
      lj_ir_kvalue(pjStack_18->L,(TValue *)&tv,load);
      pcVar4 = lj_tab_get(pjStack_18->L,
                          (GCtab *)(pjStack_18->cur).ir[(ulong)(_ref2->field_0).op1 + 1],
                          (cTValue *)&tv);
      if (((pjStack_18->fold).ins.field_1.t.irt & 0x1f) == 0xe) {
        TVar3 = lj_ir_knum_u64(pjStack_18,pcVar4->u64);
        return TVar3;
      }
      TVar3 = lj_ir_kgc(pjStack_18,(GCobj *)(pcVar4->u64 & 0x7fffffffffff),IRT_STR);
      return TVar3;
    }
  }
LAB_001a55bb:
  uVar1 = pjStack_18->chain[(pjStack_18->fold).ins.field_1.o];
  while( true ) {
    store._0_4_ = (uint)uVar1;
    if ((uint)store <= store._4_4_) {
      return 0;
    }
    pIVar5 = (pjStack_18->cur).ir + (uint)store;
    if ((pIVar5->field_0).op1 == xr._4_4_) break;
    uVar1 = (pIVar5->field_0).prev;
  }
  return (uint)store;
}

Assistant:

static TRef fwd_ahload(jit_State *J, IRRef xref)
{
  IRIns *xr = IR(xref);
  IRRef lim = xref;  /* Search limit. */
  IRRef ref;

  /* Search for conflicting stores. */
  ref = J->chain[fins->o+IRDELTA_L2S];
  while (ref > xref) {
    IRIns *store = IR(ref);
    switch (aa_ahref(J, xr, IR(store->op1))) {
    case ALIAS_NO:   break;  /* Continue searching. */
    case ALIAS_MAY:  lim = ref; goto cselim;  /* Limit search for load. */
    case ALIAS_MUST: return store->op2;  /* Store forwarding. */
    }
    ref = store->prev;
  }

  /* No conflicting store (yet): const-fold loads from allocations. */
  {
    IRIns *ir = (xr->o == IR_HREFK || xr->o == IR_AREF) ? IR(xr->op1) : xr;
    IRRef tab = ir->op1;
    ir = IR(tab);
    if (ir->o == IR_TNEW || (ir->o == IR_TDUP && irref_isk(xr->op2))) {
      /* A NEWREF with a number key may end up pointing to the array part.
      ** But it's referenced from HSTORE and not found in the ASTORE chain.
      ** For now simply consider this a conflict without forwarding anything.
      */
      if (xr->o == IR_AREF) {
	IRRef ref2 = J->chain[IR_NEWREF];
	while (ref2 > tab) {
	  IRIns *newref = IR(ref2);
	  if (irt_isnum(IR(newref->op2)->t))
	    goto cselim;
	  ref2 = newref->prev;
	}
      }
      /* NEWREF inhibits CSE for HREF, and dependent FLOADs from HREFK/AREF.
      ** But the above search for conflicting stores was limited by xref.
      ** So continue searching, limited by the TNEW/TDUP. Store forwarding
      ** is ok, too. A conflict does NOT limit the search for a matching load.
      */
      while (ref > tab) {
	IRIns *store = IR(ref);
	switch (aa_ahref(J, xr, IR(store->op1))) {
	case ALIAS_NO:   break;  /* Continue searching. */
	case ALIAS_MAY:  goto cselim;  /* Conflicting store. */
	case ALIAS_MUST: return store->op2;  /* Store forwarding. */
	}
	ref = store->prev;
      }
      if (ir->o == IR_TNEW && !irt_isnil(fins->t))
	return 0;  /* Type instability in loop-carried dependency. */
      if (irt_ispri(fins->t)) {
	return TREF_PRI(irt_type(fins->t));
      } else if (irt_isnum(fins->t) || (LJ_DUALNUM && irt_isint(fins->t)) ||
		 irt_isstr(fins->t)) {
	TValue keyv;
	cTValue *tv;
	IRIns *key = IR(xr->op2);
	if (key->o == IR_KSLOT) key = IR(key->op1);
	lj_ir_kvalue(J->L, &keyv, key);
	tv = lj_tab_get(J->L, ir_ktab(IR(ir->op1)), &keyv);
	lj_assertJ(itype2irt(tv) == irt_type(fins->t),
		   "mismatched type in constant table");
	if (irt_isnum(fins->t))
	  return lj_ir_knum_u64(J, tv->u64);
	else if (LJ_DUALNUM && irt_isint(fins->t))
	  return lj_ir_kint(J, intV(tv));
	else
	  return lj_ir_kstr(J, strV(tv));
      }
      /* Othwerwise: don't intern as a constant. */
    }
  }

cselim:
  /* Try to find a matching load. Below the conflicting store, if any. */
  ref = J->chain[fins->o];
  while (ref > lim) {
    IRIns *load = IR(ref);
    if (load->op1 == xref)
      return ref;  /* Load forwarding. */
    ref = load->prev;
  }
  return 0;  /* Conflict or no match. */
}